

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_stream.h
# Opt level: O0

OutStream * __thiscall
r_comp::OutStream::insert<std::__cxx11::string>
          (OutStream *this,uint64_t index,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  ostringstream *poVar1;
  streamoff __off;
  unsigned_short *puVar2;
  fpos<__mbstate_t> *pfVar3;
  size_t sVar4;
  ushort local_a2;
  undefined1 auStack_a0 [6];
  uint16_t i;
  __mbstate_t local_98;
  streamoff local_90;
  streamoff offset;
  string local_78 [32];
  string local_58 [8];
  string s;
  uint16_t stream_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  uint64_t index_local;
  OutStream *this_local;
  
  puVar2 = r_code::vector<unsigned_short>::operator[](&this->code_indexes_to_stream_indexes,index);
  local_a2 = *puVar2;
  poVar1 = this->stream;
  pfVar3 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](&this->positions,(ulong)local_a2);
  std::ostream::seekp(poVar1,pfVar3->_M_off,pfVar3->_M_state);
  std::__cxx11::ostringstream::str();
  pfVar3 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](&this->positions,(ulong)local_a2);
  std::fpos::operator_cast_to_long((fpos *)pfVar3);
  std::__cxx11::string::substr((ulong)local_58,(ulong)local_78);
  std::__cxx11::string::~string(local_78);
  std::operator<<((ostream *)this->stream,(string *)t);
  _auStack_a0 = (fpos<__mbstate_t>)std::ostream::tellp();
  pfVar3 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](&this->positions,(ulong)local_a2);
  local_90 = std::fpos<__mbstate_t>::operator-((fpos<__mbstate_t> *)auStack_a0,pfVar3);
  std::operator<<((ostream *)this->stream,local_58);
  while( true ) {
    local_a2 = local_a2 + 1;
    sVar4 = r_code::vector<std::fpos<__mbstate_t>_>::size(&this->positions);
    __off = local_90;
    if (sVar4 <= local_a2) break;
    pfVar3 = r_code::vector<std::fpos<__mbstate_t>_>::operator[](&this->positions,(ulong)local_a2);
    std::fpos<__mbstate_t>::operator+=(pfVar3,__off);
  }
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

OutStream &insert(uint64_t index, const T &t)   // inserts before code_indexes_to_stream_indexes[index]
    {
        uint16_t stream_index = code_indexes_to_stream_indexes[index];
        stream->seekp(positions[stream_index]);
        std::string s = stream->str().substr(positions[stream_index]);
        *stream << t;
        std::streamoff offset = stream->tellp() - positions[stream_index];
        *stream << s;

        for (uint16_t i = stream_index + 1; i < positions.size(); ++i) { // right-shift
            positions[i] += offset;
        }

        return *this;
    }